

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

void __thiscall
dxil_spv::CFGStructurizer::visit_for_back_edge_analysis(CFGStructurizer *this,CFGNode *entry)

{
  bool bVar1;
  Vector<CFGNode_*> *pVVar2;
  size_type sVar3;
  reference ppCVar4;
  CFGNode *local_a8;
  CFGNode *local_a0;
  CFGNode *n;
  iterator __end2;
  iterator __begin2;
  Vector<CFGNode_*> *__range2;
  CFGNode *local_60;
  CFGNode *new_back_edge;
  CFGNode *local_50;
  CFGNode *succ;
  iterator __end1;
  iterator __begin1;
  Vector<CFGNode_*> *__range1;
  CFGNode *local_20;
  CFGNode *local_18;
  CFGNode *entry_local;
  CFGStructurizer *this_local;
  
  entry->visited = true;
  entry->traversing = true;
  local_20 = entry;
  local_18 = entry;
  entry_local = (CFGNode *)this;
  std::
  unordered_set<const_dxil_spv::CFGNode_*,_std::hash<const_dxil_spv::CFGNode_*>,_std::equal_to<const_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>_>
  ::insert(&this->reachable_nodes,&local_20);
  pVVar2 = &local_18->succ;
  __end1 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
           begin(pVVar2);
  succ = (CFGNode *)
         std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::end
                   (pVVar2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                     *)&succ), bVar1) {
    ppCVar4 = __gnu_cxx::
              __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
              ::operator*(&__end1);
    local_50 = *ppCVar4;
    if ((local_50->traversing & 1U) == 0) {
      if ((local_50->visited & 1U) == 0) {
        visit_for_back_edge_analysis(this,local_50);
      }
    }
    else {
      new_back_edge = local_18;
      std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
      push_back(&local_50->fake_pred,&new_back_edge);
    }
    __gnu_cxx::
    __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
    ::operator++(&__end1);
  }
  local_18->traversing = false;
  sVar3 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
          size(&local_18->fake_pred);
  if (1 < sVar3) {
    local_60 = CFGNodePool::create_node(this->pool);
    std::operator+((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                    *)&__range2,&local_18->name,".back-edge-merge");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::operator=(&local_60->name,
                (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *
                )&__range2);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::~basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                     *)&__range2);
    pVVar2 = &local_18->fake_pred;
    __end2 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ::begin(pVVar2);
    n = (CFGNode *)
        std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::end
                  (pVVar2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                       *)&n), bVar1) {
      ppCVar4 = __gnu_cxx::
                __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                ::operator*(&__end2);
      local_a0 = *ppCVar4;
      CFGNode::retarget_branch_pre_traversal(local_a0,local_18,local_60);
      __gnu_cxx::
      __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
      ::operator++(&__end2);
    }
    local_a8 = local_18;
    std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
    push_back(&local_60->succ,&local_a8);
    (local_60->ir).terminator.type = Branch;
    (local_60->ir).terminator.direct_block = local_18;
    CFGNode::add_branch(local_60,local_18);
  }
  return;
}

Assistant:

void CFGStructurizer::visit_for_back_edge_analysis(CFGNode &entry)
{
	entry.visited = true;
	entry.traversing = true;
	reachable_nodes.insert(&entry);

	for (auto *succ : entry.succ)
	{
		// Reuse the existing vector to keep track of back edges.
		if (succ->traversing)
			succ->fake_pred.push_back(&entry);
		else if (!succ->visited)
			visit_for_back_edge_analysis(*succ);
	}

	entry.traversing = false;

	// After we get here, we must have observed all back edges.
	// If there is more than one back edge, merge them.
	if (entry.fake_pred.size() >= 2)
	{
		auto *new_back_edge = pool.create_node();
		new_back_edge->name = entry.name + ".back-edge-merge";
		for (auto *n : entry.fake_pred)
			n->retarget_branch_pre_traversal(&entry, new_back_edge);
		new_back_edge->succ.push_back(&entry);
		new_back_edge->ir.terminator.type = Terminator::Type::Branch;
		new_back_edge->ir.terminator.direct_block = &entry;
		new_back_edge->add_branch(&entry);
	}
}